

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHeader.h
# Opt level: O3

MessageHeader * __thiscall
io::aeron::archive::codecs::MessageHeader::wrap
          (MessageHeader *this,char *buffer,uint64_t offset,uint64_t actingVersion,
          uint64_t bufferLength)

{
  MessageHeader *this_00;
  undefined8 extraout_RAX;
  
  if (offset + 8 <= bufferLength) {
    this->m_buffer = buffer;
    this->m_bufferLength = bufferLength;
    this->m_offset = offset;
    this->m_actingVersion = actingVersion;
    return this;
  }
  this_00 = (MessageHeader *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            ((runtime_error *)this_00,"buffer too short for flyweight [E107]");
  wrap(this_00);
  __cxa_free_exception(this_00);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

inline void reset(char *buffer, const std::uint64_t offset, const std::uint64_t bufferLength, const std::uint64_t actingVersion)
    {
        if (SBE_BOUNDS_CHECK_EXPECT(((offset + 8) > bufferLength), false))
        {
            throw std::runtime_error("buffer too short for flyweight [E107]");
        }

        m_buffer = buffer;
        m_bufferLength = bufferLength;
        m_offset = offset;
        m_actingVersion = actingVersion;
    }